

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O0

Unique<Entry<Box<3L>_>_> __thiscall
anurbs::Entry<anurbs::Box<3L>_>::create
          (Entry<anurbs::Box<3L>_> *this,string *key,shared_ptr<anurbs::Box<3L>_> *data)

{
  unique_ptr<anurbs::Attributes,_std::default_delete<anurbs::Attributes>_> local_38;
  undefined1 local_30 [8];
  Pointer<Attributes> attributes;
  shared_ptr<anurbs::Box<3L>_> *data_local;
  string *key_local;
  
  attributes.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)data;
  new_<anurbs::Attributes>();
  std::shared_ptr<anurbs::Attributes>::
  shared_ptr<anurbs::Attributes,std::default_delete<anurbs::Attributes>,void>
            ((shared_ptr<anurbs::Attributes> *)local_30,&local_38);
  std::unique_ptr<anurbs::Attributes,_std::default_delete<anurbs::Attributes>_>::~unique_ptr
            (&local_38);
  new_<anurbs::Entry<anurbs::Box<3l>>,std::__cxx11::string&,std::shared_ptr<anurbs::Box<3l>>&,std::shared_ptr<anurbs::Attributes>&>
            ((anurbs *)this,key,data,(shared_ptr<anurbs::Attributes> *)local_30);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr((shared_ptr<anurbs::Attributes> *)local_30);
  return (__uniq_ptr_data<anurbs::Entry<anurbs::Box<3L>_>,_std::default_delete<anurbs::Entry<anurbs::Box<3L>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::Box<3L>_>,_std::default_delete<anurbs::Entry<anurbs::Box<3L>_>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Entry<TData>> create(std::string key,
        std::shared_ptr<TData> data)
    {
        Pointer<Attributes> attributes = new_<Attributes>();
        return new_<Entry<TData>>(key, data, attributes);
    }